

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

symbol * Symbol_find(char *key)

{
  s_x2node *psVar1;
  s_x2 *psVar2;
  int iVar3;
  s_x2node **ppsVar4;
  
  psVar2 = x2a;
  if (x2a != (s_x2 *)0x0) {
    iVar3 = strhash(key);
    ppsVar4 = psVar2->ht + ((long)iVar3 & (long)psVar2->size - 1U);
    while (psVar1 = *ppsVar4, psVar1 != (s_x2node *)0x0) {
      iVar3 = strcmp(psVar1->key,key);
      if (iVar3 == 0) {
        return psVar1->data;
      }
      ppsVar4 = &psVar1->next;
    }
  }
  return (symbol *)0x0;
}

Assistant:

struct symbol *Symbol_find(const char *key)
{
  int h;
  x2node *np;

  if( x2a==0 ) return 0;
  h = strhash(key) & (x2a->size-1);
  np = x2a->ht[h];
  while( np ){
    if( strcmp(np->key,key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}